

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall sqvector<SQClassMember>::~sqvector(sqvector<SQClassMember> *this)

{
  SQUnsignedInteger in_RDI;
  SQUnsignedInteger i;
  SQClassMember *this_00;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    for (this_00 = (SQClassMember *)0x0; this_00 < *(SQClassMember **)(in_RDI + 8);
        this_00 = (SQClassMember *)((long)&(this_00->val).super_SQObject._type + 1)) {
      SQClassMember::~SQClassMember(this_00);
    }
    sq_vm_free(this_00,in_RDI);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }